

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O3

void __thiscall
sf::RenderTarget::drawPrimitives
          (RenderTarget *this,PrimitiveType type,size_t firstVertex,size_t vertexCount)

{
  (*sf_glad_glDrawArrays)(drawPrimitives::modes[type],(GLint)firstVertex,(GLsizei)vertexCount);
  return;
}

Assistant:

void RenderTarget::drawPrimitives(PrimitiveType type, std::size_t firstVertex, std::size_t vertexCount)
{
    // Find the OpenGL primitive type
    static const GLenum modes[] = {GL_POINTS, GL_LINES, GL_LINE_STRIP, GL_TRIANGLES,
                                   GL_TRIANGLE_STRIP, GL_TRIANGLE_FAN, GL_QUADS};
    GLenum mode = modes[type];

    // Draw the primitives
    glCheck(glDrawArrays(mode, static_cast<GLint>(firstVertex), static_cast<GLsizei>(vertexCount)));
}